

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O2

void __thiscall
cp::PlanFootprints::init_setup
          (PlanFootprints *this,Affine3d *init_leg_pose,Quat *waist_q,Vector3 *com,double *endcpoff)

{
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  Transform<double,_3,_2,_0> *t;
  Pose *this_01;
  long lVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_d8;
  undefined8 local_b8;
  undefined8 local_b0;
  Vector3 trans;
  Quat q;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_50;
  
  this_01 = (Pose *)(this + 0x310);
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    local_d8.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)((long)init_leg_pose + 0x60);
    local_d8.m_currentBlockRows = 0;
    local_b8 = 3;
    local_b0 = 4;
    local_d8.m_col = (Index)init_leg_pose;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,3,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&trans,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_1,_true>_> *)
               &local_d8);
    Eigen::internal::transform_rotation_impl<2>::run<Eigen::Transform<double,3,2,0>>
              ((LinearMatrixType *)&local_d8,(transform_rotation_impl<2> *)init_leg_pose,t);
    Eigen::internal::quaternionbase_assign_impl<Eigen::Matrix<double,3,3,0,3,3>,3,3>::
    run<Eigen::Quaternion<double,0>>
              ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&q,
               (Matrix<double,_3,_3,_0,_3,_3> *)&local_d8);
    Pose::set(this_01,&trans,&q);
    Pose::set((Pose *)(this_01[-4].af.m_matrix.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
                       .array + 8),this_01);
    Eigen::CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>::
    CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>
              ((CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>> *)&local_50,
               (Matrix<double,_3,_1,_0,_3,_1> *)(this + lVar1 + 0x4d8),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&trans);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(&local_50);
    this_01 = this_01 + 1;
    init_leg_pose = (Affine3d *)((long)init_leg_pose + 0x80);
  }
  Pose::set((Pose *)(this + 0x1d0),com,waist_q);
  local_d8.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)(this + 0x2d0);
  local_d8.m_row = 0;
  local_d8.m_col = 1;
  local_d8.m_currentBlockRows = 1;
  *(double *)(this + 0x2d0) =
       (com->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_d8,
             (com->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array + 1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_d8);
  *(double *)(this + 0x508) = *endcpoff;
  *(double *)(this + 0x510) = endcpoff[1];
  local_d8.m_xpr = (Matrix<double,_3,_1,_0,_3,_1> *)(this + 0x2e8);
  local_d8.m_row = 0;
  local_d8.m_col = 1;
  local_d8.m_currentBlockRows = 1;
  *(undefined8 *)(this + 0x2e8) = 0;
  q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      (&local_d8,(Scalar *)&q);
  trans.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
            (this_00,(Scalar *)&trans);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished(&local_d8);
  *(undefined8 *)(this + 0x300) = 0;
  *(undefined4 *)(this + 0x4d0) = 0;
  return;
}

Assistant:

void PlanFootprints::init_setup(const Affine3d init_leg_pose[],
                                const Quat& waist_q, const Vector3& com,
                                const double endcpoff[]) {
  for (int i = 0; i < 2; ++i) {
    Vector3 trans = init_leg_pose[i].translation();
    Quat q(init_leg_pose[i].rotation());
    init_feet_pose[i].set(trans, q);
    ref_land_pose[i].set(init_feet_pose[i]);
    dist_body2foot[i] << trans;  // TODO! subtraction to body position
  }
  ref_waist_pose.set(com, waist_q);
  // ref_waist_r = waist_r;
  end_cp << com[0], com[1];
  end_cp_offset[0] = endcpoff[0];  end_cp_offset[1] = endcpoff[1];
  step_vector << 0.0, 0.0, 0.0;
  step_angle = 0.0;
  step_num = 0;
}